

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode_utils_basis.h
# Opt level: O1

void __thiscall
ktx::OptionsEncodeBasis<true>::process
          (OptionsEncodeBasis<true> *this,Options *param_1,ParseResult *args,Reporter *report)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  size_t sVar3;
  size_type sVar4;
  BasisCodec BVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  OptionValue *pOVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar11;
  size_type sVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  string codec_option;
  allocator<char> local_99;
  string local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_78;
  size_type local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  string local_58;
  Reporter *local_38;
  
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"encode","");
  std::__cxx11::string::_M_replace((ulong)&local_58,0,(char *)local_58._M_string_length,0x20d307);
  pOVar10 = cxxopts::ParseResult::operator[](args,&local_58);
  BVar5 = validateBasisCodec(this,pOVar10);
  this->codec = BVar5;
  if (BVar5 - BasisLZ < 2) {
    local_38 = report;
    pOVar10 = cxxopts::ParseResult::operator[](args,&local_58);
    pbVar11 = cxxopts::OptionValue::as<std::__cxx11::string>(pOVar10);
    pcVar2 = (pbVar11->_M_dataplus)._M_p;
    local_78 = &local_68;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_78,pcVar2,pcVar2 + pbVar11->_M_string_length);
    sVar4 = local_70;
    paVar1 = local_78;
    if (local_70 != 0) {
      sVar12 = 0;
      do {
        iVar6 = tolower((int)paVar1->_M_local_buf[sVar12]);
        paVar1->_M_local_buf[sVar12] = (char)iVar6;
        sVar12 = sVar12 + 1;
      } while (sVar4 != sVar12);
    }
    if (local_78 == &local_68) {
      local_98.field_2._8_8_ = local_68._8_8_;
      local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    }
    else {
      local_98._M_dataplus._M_p = (pointer)local_78;
    }
    local_98.field_2._M_allocated_capacity._1_7_ = local_68._M_allocated_capacity._1_7_;
    local_98.field_2._M_local_buf[0] = local_68._M_local_buf[0];
    local_98._M_string_length = local_70;
    local_70 = 0;
    local_68._M_local_buf[0] = '\0';
    local_78 = &local_68;
    std::__cxx11::string::operator=((string *)&this->codecName,(string *)&local_98);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    report = local_38;
    if (local_78 != &local_68) {
      operator_delete(local_78,CONCAT71(local_68._M_allocated_capacity._1_7_,
                                        local_68._M_local_buf[0]) + 1);
      report = local_38;
    }
  }
  else if (BVar5 != NONE) {
    pOVar10 = cxxopts::ParseResult::operator[](args,&local_58);
    pbVar11 = cxxopts::OptionValue::as<std::__cxx11::string>(pOVar10);
    Reporter::fatal_usage<char_const(&)[28],std::__cxx11::string_const&>
              (report,(char (*) [28])"Invalid encode codec: \"{}\".",pbVar11);
  }
  if (this->codec == UASTC) {
    (this->super_ktxBasisParams).uastc = true;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,kCLevel,&local_99);
  pOVar10 = cxxopts::ParseResult::operator[](args,&local_98);
  sVar3 = pOVar10->m_count;
  paVar1 = &local_98.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar1) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  if (sVar3 != 0) {
    local_98._M_dataplus._M_p = kCLevel;
    if (this->codec != BasisLZ) {
      Reporter::fatal<char_const(&)[79],char_const*&>
                (report,INVALID_ARGUMENTS,
                 (char (*) [79])
                 "Invalid use of argument --{} that only applies when the used codec is BasisLZ.",
                 (char **)&local_98);
    }
    uVar7 = captureCodecOption<unsigned_int>(this,args,kCLevel);
    (this->super_ktxBasisParams).compressionLevel = uVar7;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,kQLevel,&local_99);
  pOVar10 = cxxopts::ParseResult::operator[](args,&local_98);
  sVar3 = pOVar10->m_count;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar1) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  if (sVar3 != 0) {
    local_98._M_dataplus._M_p = kQLevel;
    if (this->codec != BasisLZ) {
      Reporter::fatal<char_const(&)[79],char_const*&>
                (report,INVALID_ARGUMENTS,
                 (char (*) [79])
                 "Invalid use of argument --{} that only applies when the used codec is BasisLZ.",
                 (char **)&local_98);
    }
    uVar8 = captureCodecOption<unsigned_int>(this,args,kQLevel);
    uVar7 = (this->qualityLevel).min;
    uVar9 = (this->qualityLevel).max;
    if (uVar8 <= uVar9) {
      uVar9 = uVar8;
    }
    if (uVar8 < uVar7) {
      uVar9 = uVar7;
    }
    *(this->qualityLevel).option = uVar9;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,kNoEndpointRdo,&local_99);
  pOVar10 = cxxopts::ParseResult::operator[](args,&local_98);
  sVar3 = pOVar10->m_count;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar1) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  if (sVar3 != 0) {
    local_98._M_dataplus._M_p = kNoEndpointRdo;
    if (this->codec != BasisLZ) {
      Reporter::fatal<char_const(&)[79],char_const*&>
                (report,INVALID_ARGUMENTS,
                 (char (*) [79])
                 "Invalid use of argument --{} that only applies when the used codec is BasisLZ.",
                 (char **)&local_98);
    }
    captureCodecOption(this,kNoEndpointRdo);
    (this->super_ktxBasisParams).noEndpointRDO = true;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,kNoSelectorRdo,&local_99);
  pOVar10 = cxxopts::ParseResult::operator[](args,&local_98);
  sVar3 = pOVar10->m_count;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar1) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  if (sVar3 != 0) {
    local_98._M_dataplus._M_p = kNoSelectorRdo;
    if (this->codec != BasisLZ) {
      Reporter::fatal<char_const(&)[79],char_const*&>
                (report,INVALID_ARGUMENTS,
                 (char (*) [79])
                 "Invalid use of argument --{} that only applies when the used codec is BasisLZ.",
                 (char **)&local_98);
    }
    captureCodecOption(this,kNoSelectorRdo);
    (this->super_ktxBasisParams).noSelectorRDO = true;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,kMaxEndpoints,&local_99);
  pOVar10 = cxxopts::ParseResult::operator[](args,&local_98);
  sVar3 = pOVar10->m_count;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar1) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  if (sVar3 != 0) {
    validateBasisLZEndpointRDOArg(this,report,kMaxEndpoints);
    uVar8 = captureCodecOption<unsigned_int>(this,args,kMaxEndpoints);
    uVar7 = (this->maxEndpoints).min;
    uVar9 = (this->maxEndpoints).max;
    if (uVar8 <= uVar9) {
      uVar9 = uVar8;
    }
    if (uVar8 < uVar7) {
      uVar9 = uVar7;
    }
    *(this->maxEndpoints).option = uVar9;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,kEndpointRdoThreshold,&local_99);
  pOVar10 = cxxopts::ParseResult::operator[](args,&local_98);
  sVar3 = pOVar10->m_count;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar1) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  if (sVar3 != 0) {
    validateBasisLZEndpointRDOArg(this,report,kEndpointRdoThreshold);
    fVar13 = captureCodecOption<float>(this,args,kEndpointRdoThreshold);
    (this->super_ktxBasisParams).endpointRDOThreshold = fVar13;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,kMaxSelectors,&local_99);
  pOVar10 = cxxopts::ParseResult::operator[](args,&local_98);
  sVar3 = pOVar10->m_count;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar1) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  if (sVar3 != 0) {
    validateBasisLZSelectorRDOArg(this,report,kMaxSelectors);
    uVar8 = captureCodecOption<unsigned_int>(this,args,kMaxSelectors);
    uVar7 = (this->maxSelectors).min;
    uVar9 = (this->maxSelectors).max;
    if (uVar8 <= uVar9) {
      uVar9 = uVar8;
    }
    if (uVar8 < uVar7) {
      uVar9 = uVar7;
    }
    *(this->maxSelectors).option = uVar9;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,kSelectorRdoThreshold,&local_99);
  pOVar10 = cxxopts::ParseResult::operator[](args,&local_98);
  sVar3 = pOVar10->m_count;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar1) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  if (sVar3 != 0) {
    validateBasisLZSelectorRDOArg(this,report,kSelectorRdoThreshold);
    fVar13 = captureCodecOption<float>(this,args,kSelectorRdoThreshold);
    (this->super_ktxBasisParams).selectorRDOThreshold = fVar13;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,kUastcQuality,&local_99);
  pOVar10 = cxxopts::ParseResult::operator[](args,&local_98);
  sVar3 = pOVar10->m_count;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar1) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  if (sVar3 != 0) {
    local_98._M_dataplus._M_p = kUastcQuality;
    if (this->codec != UASTC) {
      Reporter::fatal<char_const(&)[77],char_const*&>
                (report,INVALID_ARGUMENTS,
                 (char (*) [77])
                 "Invalid use of argument --{} that only applies when the used codec is UASTC.",
                 (char **)&local_98);
    }
    uVar9 = captureCodecOption<unsigned_int>(this,args,kUastcQuality);
    uVar7 = 4;
    if (uVar9 < 4) {
      uVar7 = uVar9;
    }
    (this->super_ktxBasisParams).uastcFlags = uVar7 | 0xfffffff0;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,kUastcRdo,&local_99);
  pOVar10 = cxxopts::ParseResult::operator[](args,&local_98);
  sVar3 = pOVar10->m_count;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar1) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  if (sVar3 != 0) {
    local_98._M_dataplus._M_p = kUastcRdo;
    if (this->codec != UASTC) {
      Reporter::fatal<char_const(&)[77],char_const*&>
                (report,INVALID_ARGUMENTS,
                 (char (*) [77])
                 "Invalid use of argument --{} that only applies when the used codec is UASTC.",
                 (char **)&local_98);
    }
    captureCodecOption(this,kUastcRdo);
    (this->super_ktxBasisParams).uastcRDO = true;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,kUastcRdoL,&local_99);
  pOVar10 = cxxopts::ParseResult::operator[](args,&local_98);
  sVar3 = pOVar10->m_count;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar1) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  if (sVar3 != 0) {
    validateUASTCRDOArg(this,report,kUastcRdoL);
    fVar14 = captureCodecOption<float>(this,args,kUastcRdoL);
    fVar13 = (this->uastcRDOQualityScalar).min;
    fVar15 = (this->uastcRDOQualityScalar).max;
    if (fVar14 <= fVar15) {
      fVar15 = fVar14;
    }
    uVar7 = -(uint)(fVar14 < fVar13);
    *(this->uastcRDOQualityScalar).option = (float)(uVar7 & (uint)fVar13 | ~uVar7 & (uint)fVar15);
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,kUastcRdoD,&local_99);
  pOVar10 = cxxopts::ParseResult::operator[](args,&local_98);
  sVar3 = pOVar10->m_count;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar1) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  if (sVar3 != 0) {
    validateUASTCRDOArg(this,report,kUastcRdoD);
    uVar8 = captureCodecOption<unsigned_int>(this,args,kUastcRdoD);
    uVar7 = (this->uastcRDODictSize).min;
    uVar9 = (this->uastcRDODictSize).max;
    if (uVar8 <= uVar9) {
      uVar9 = uVar8;
    }
    if (uVar8 < uVar7) {
      uVar9 = uVar7;
    }
    *(this->uastcRDODictSize).option = uVar9;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,kUastcRdoB,&local_99);
  pOVar10 = cxxopts::ParseResult::operator[](args,&local_98);
  sVar3 = pOVar10->m_count;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar1) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  if (sVar3 != 0) {
    validateUASTCRDOArg(this,report,kUastcRdoB);
    fVar14 = captureCodecOption<float>(this,args,kUastcRdoB);
    fVar13 = (this->uastcRDOMaxSmoothBlockErrorScale).min;
    fVar15 = (this->uastcRDOMaxSmoothBlockErrorScale).max;
    if (fVar14 <= fVar15) {
      fVar15 = fVar14;
    }
    uVar7 = -(uint)(fVar14 < fVar13);
    *(this->uastcRDOMaxSmoothBlockErrorScale).option =
         (float)(uVar7 & (uint)fVar13 | ~uVar7 & (uint)fVar15);
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,kUastcRdoS,&local_99);
  pOVar10 = cxxopts::ParseResult::operator[](args,&local_98);
  sVar3 = pOVar10->m_count;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar1) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  if (sVar3 != 0) {
    validateUASTCRDOArg(this,report,kUastcRdoS);
    fVar14 = captureCodecOption<float>(this,args,kUastcRdoS);
    fVar13 = (this->uastcRDOMaxSmoothBlockStdDev).min;
    fVar15 = (this->uastcRDOMaxSmoothBlockStdDev).max;
    if (fVar14 <= fVar15) {
      fVar15 = fVar14;
    }
    uVar7 = -(uint)(fVar14 < fVar13);
    *(this->uastcRDOMaxSmoothBlockStdDev).option =
         (float)(uVar7 & (uint)fVar13 | ~uVar7 & (uint)fVar15);
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,kUastcRdoF,&local_99);
  pOVar10 = cxxopts::ParseResult::operator[](args,&local_98);
  sVar3 = pOVar10->m_count;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar1) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  if (sVar3 != 0) {
    validateUASTCRDOArg(this,report,kUastcRdoF);
    captureCodecOption(this,kUastcRdoF);
    (this->super_ktxBasisParams).uastcRDODontFavorSimplerModes = true;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,kUastcRdoM,&local_99);
  pOVar10 = cxxopts::ParseResult::operator[](args,&local_98);
  sVar3 = pOVar10->m_count;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar1) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  if (sVar3 != 0) {
    validateUASTCRDOArg(this,report,kUastcRdoM);
    captureCodecOption(this,kUastcRdoM);
    (this->super_ktxBasisParams).uastcRDONoMultithreading = true;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void process(cxxopts::Options&, cxxopts::ParseResult& args, Reporter& report) {
        std::string codec_option{"encode"};

        if (ENCODE_CMD) {
            codec_option = "codec";
        }

        codec = validateBasisCodec(args[codec_option]);
        switch (codec) {
        case BasisCodec::NONE:
            // Not specified
            break;

        case BasisCodec::BasisLZ:
        case BasisCodec::UASTC:
            codecName = to_lower_copy(args[codec_option].as<std::string>());
            break;

        default:
            report.fatal_usage("Invalid encode codec: \"{}\".", args[codec_option].as<std::string>());
            break;
        }

        if (codec == BasisCodec::UASTC) {
            uastc = 1;
        }

        // NOTE: The order of the validation below matters

        if (args[kCLevel].count()) {
            validateBasisLZArg(report, kCLevel);
            compressionLevel = captureCodecOption<uint32_t>(args, kCLevel);;
        }

        if (args[kQLevel].count()) {
            validateBasisLZArg(report, kQLevel);
            qualityLevel = captureCodecOption<uint32_t>(args, kQLevel);
        }

        if (args[kNoEndpointRdo].count()) {
            validateBasisLZArg(report, kNoEndpointRdo);
            captureCodecOption(kNoEndpointRdo);
            noEndpointRDO = 1;
        }

        if (args[kNoSelectorRdo].count()) {
            validateBasisLZArg(report, kNoSelectorRdo);
            captureCodecOption(kNoSelectorRdo);
            noSelectorRDO = 1;
        }

        if (args[kMaxEndpoints].count()) {
            validateBasisLZEndpointRDOArg(report, kMaxEndpoints);
            maxEndpoints = captureCodecOption<uint32_t>(args, kMaxEndpoints);
        }

        if (args[kEndpointRdoThreshold].count()) {
            validateBasisLZEndpointRDOArg(report, kEndpointRdoThreshold);
            endpointRDOThreshold = captureCodecOption<float>(args, kEndpointRdoThreshold);
        }

        if (args[kMaxSelectors].count()) {
            validateBasisLZSelectorRDOArg(report, kMaxSelectors);
            maxSelectors = captureCodecOption<uint32_t>(args, kMaxSelectors);
        }

        if (args[kSelectorRdoThreshold].count()) {
            validateBasisLZSelectorRDOArg(report, kSelectorRdoThreshold);
            selectorRDOThreshold = captureCodecOption<float>(args, kSelectorRdoThreshold);
        }

        if (args[kUastcQuality].count()) {
            validateUASTCArg(report, kUastcQuality);
            uint32_t level = captureCodecOption<uint32_t>(args, kUastcQuality);
            level = std::clamp<uint32_t>(level, 0, KTX_PACK_UASTC_MAX_LEVEL);
            uastcFlags = (unsigned int)~KTX_PACK_UASTC_LEVEL_MASK;
            uastcFlags |= level;
        }

        if (args[kUastcRdo].count()) {
            validateUASTCArg(report, kUastcRdo);
            captureCodecOption(kUastcRdo);
            uastcRDO = 1;
        }

        if (args[kUastcRdoL].count()) {
            validateUASTCRDOArg(report, kUastcRdoL);
            uastcRDOQualityScalar = captureCodecOption<float>(args, kUastcRdoL);
        }

        if (args[kUastcRdoD].count()) {
            validateUASTCRDOArg(report, kUastcRdoD);
            uastcRDODictSize = captureCodecOption<uint32_t>(args, kUastcRdoD);
        }

        if (args[kUastcRdoB].count()) {
            validateUASTCRDOArg(report, kUastcRdoB);
            uastcRDOMaxSmoothBlockErrorScale = captureCodecOption<float>(args, kUastcRdoB);
        }

        if (args[kUastcRdoS].count()) {
            validateUASTCRDOArg(report, kUastcRdoS);
            uastcRDOMaxSmoothBlockStdDev = captureCodecOption<float>(args, kUastcRdoS);
        }

        if (args[kUastcRdoF].count()) {
            validateUASTCRDOArg(report, kUastcRdoF);
            captureCodecOption(kUastcRdoF);
            uastcRDODontFavorSimplerModes = 1;
        }

        if (args[kUastcRdoM].count()) {
            validateUASTCRDOArg(report, kUastcRdoM);
            captureCodecOption(kUastcRdoM);
            uastcRDONoMultithreading = 1;
        }
    }